

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS ref_migrate_native_rcb_part(REF_GRID ref_grid,REF_INT npart,REF_INT *node_part)

{
  REF_MPI ref_mpi;
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  REF_DBL *xyz;
  REF_INT *owners;
  REF_INT *locals;
  long lVar8;
  undefined8 uVar9;
  REF_STATUS RVar10;
  char *pcVar11;
  long lVar12;
  REF_INT n;
  size_t __size;
  double dVar13;
  REF_DBL psi;
  REF_BOOL in_stack_ffffffffffffff58;
  REF_DBL transform [9];
  
  ref_mpi = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  if (0 < pRVar1->max) {
    lVar7 = 0;
    do {
      node_part[lVar7] = -1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pRVar1->max);
  }
  uVar4 = pRVar1->n;
  if ((int)uVar4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x237
           ,"ref_migrate_native_rcb_part","malloc xyz of REF_DBL negative");
    RVar10 = 1;
  }
  else {
    xyz = (REF_DBL *)malloc((ulong)uVar4 * 0x18);
    if (xyz == (REF_DBL *)0x0) {
      pcVar11 = "malloc xyz of REF_DBL NULL";
      uVar9 = 0x237;
    }
    else {
      __size = (ulong)uVar4 << 2;
      owners = (REF_INT *)malloc(__size);
      if (owners == (REF_INT *)0x0) {
        pcVar11 = "malloc owners of REF_INT NULL";
        uVar9 = 0x238;
      }
      else {
        locals = (REF_INT *)malloc(__size);
        if (locals != (REF_INT *)0x0) {
          if (pRVar1->max < 1) {
            n = 0;
          }
          else {
            pRVar2 = pRVar1->global;
            lVar7 = 0;
            lVar8 = 0;
            n = 0;
            do {
              if ((-1 < pRVar2[lVar8]) &&
                 (iVar6 = pRVar1->part[lVar8], pRVar1->ref_mpi->id == iVar6)) {
                pRVar3 = pRVar1->real;
                lVar12 = 0;
                do {
                  xyz[n * 3 + lVar12] = *(REF_DBL *)((long)pRVar3 + lVar12 * 8 + lVar7);
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 3);
                owners[n] = iVar6;
                locals[n] = (REF_INT)lVar8;
                n = n + 1;
              }
              lVar8 = lVar8 + 1;
              lVar7 = lVar7 + 0x78;
            } while (lVar8 < pRVar1->max);
          }
          if (ref_mpi->id == 0) {
            iVar6 = ref_grid->twod;
            iVar5 = rand();
            dVar13 = 0.0;
            psi = 0.0;
            if (iVar6 == 0) {
              iVar6 = rand();
              dVar13 = ((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0;
              if (1.0 <= dVar13) {
                dVar13 = 1.0;
              }
              if (dVar13 <= -1.0) {
                dVar13 = -1.0;
              }
              dVar13 = acos(dVar13);
              iVar6 = rand();
              psi = ((double)iVar6 * 6.28318530717958) / 2147483647.0;
            }
            uVar4 = ref_matrix_euler_rotation
                              (((double)iVar5 * 6.28318530717958) / 2147483647.0,dVar13,psi,
                               transform);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x252,"ref_migrate_native_rcb_part",(ulong)uVar4,"rot");
              return uVar4;
            }
          }
          uVar4 = ref_mpi_bcast(ref_mpi,transform,9,3);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x254,"ref_migrate_native_rcb_part",(ulong)uVar4);
            return uVar4;
          }
          uVar4 = ref_migrate_native_rcb_direction
                            (ref_mpi,n,xyz,transform,npart,0,owners,locals,ref_mpi,node_part,
                             ref_grid->partitioner_seed,-1,in_stack_ffffffffffffff58);
          if (uVar4 == 0) {
            iVar6 = ref_grid->partitioner_seed + 1;
            if (ref_grid->partitioner_seed < -1) {
              iVar6 = 0;
            }
            ref_grid->partitioner_seed = iVar6;
            free(locals);
            free(owners);
            free(xyz);
            ref_mpi_stopwatch_stop(ref_grid->mpi,"native RCB part");
            return 0;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x25a,"ref_migrate_native_rcb_part",(ulong)uVar4,"split");
          return uVar4;
        }
        pcVar11 = "malloc locals of REF_INT NULL";
        uVar9 = 0x239;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar9
           ,"ref_migrate_native_rcb_part",pcVar11);
    RVar10 = 2;
  }
  return RVar10;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_native_rcb_part(REF_GRID ref_grid,
                                                      REF_INT npart,
                                                      REF_INT *node_part) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node;
  REF_INT i, n;
  REF_DBL *xyz;
  REF_INT offset;
  REF_INT *owners;
  REF_INT *locals;
  REF_DBL transform[9];

  for (node = 0; node < ref_node_max(ref_node); node++)
    node_part[node] = REF_EMPTY;

  offset = 0;

  n = ref_node_n(ref_node);
  ref_malloc(xyz, 3 * n, REF_DBL);
  ref_malloc(owners, n, REF_INT);
  ref_malloc(locals, n, REF_INT);
  n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      for (i = 0; i < 3; i++) xyz[i + 3 * n] = ref_node_xyz(ref_node, i, node);
      owners[n] = ref_node_part(ref_node, node);
      locals[n] = node;
      n++;
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    REF_DBL phi, theta, psi, z;
    if (ref_grid_twod(ref_grid)) { /* restrict rotation to x-y plane */
      phi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
      theta = 0.0;
      psi = 0.0;
    } else { /* not exactly unirom sampling, should be good enough */
      phi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
      z = 2.0 * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX - 1.0;
      z = MAX(MIN(z, 1.0), -1.0); /* redundant nan safety */
      theta = acos(z);
      psi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
    }
    /* printf("phi %f theta %f psi %f\n",phi,theta,psi); */
    RSS(ref_matrix_euler_rotation(phi, theta, psi, transform), "rot");
  }
  RSS(ref_mpi_bcast(ref_mpi, transform, 9, REF_DBL_TYPE), "bcast xform");

  RSS(ref_migrate_native_rcb_direction(
          ref_mpi, n, xyz, transform, npart, offset, owners, locals, ref_mpi,
          node_part, ref_grid_partitioner_seed(ref_grid), -1,
          ref_grid_twod(ref_grid)),
      "split");
  ref_grid_partitioner_seed(ref_grid)++;
  if (ref_grid_partitioner_seed(ref_grid) < 0)
    ref_grid_partitioner_seed(ref_grid) = 0; /* overflow int */

  ref_free(locals);
  ref_free(owners);
  ref_free(xyz);

  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "native RCB part");

  return REF_SUCCESS;
}